

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::UnsafeArenaSetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  OneofDescriptor *pOVar5;
  Message **ppMVar6;
  Arena *pAVar7;
  Reflection *in_RCX;
  Reflection *in_RDX;
  Message *in_RSI;
  OneofDescriptor *in_RDI;
  FieldDescriptor *in_stack_00000010;
  Message *in_stack_00000018;
  Reflection *in_stack_00000020;
  char *in_stack_00000028;
  char *in_stack_00000030;
  undefined4 in_stack_00000038;
  CppType in_stack_0000003c;
  Message **sub_message_holder;
  MessageLite *in_stack_000000a8;
  FieldDescriptor *in_stack_000000b0;
  FieldType in_stack_000000bb;
  int in_stack_000000bc;
  ExtensionSet *in_stack_000000c0;
  Message *in_stack_ffffffffffffff98;
  Reflection *in_stack_ffffffffffffffa0;
  Message *in_stack_ffffffffffffffa8;
  Reflection *in_stack_ffffffffffffffb0;
  Message *in_stack_ffffffffffffffb8;
  Reflection *in_stack_ffffffffffffffc0;
  Message *in_stack_ffffffffffffffd8;
  
  pDVar4 = FieldDescriptor::containing_type((FieldDescriptor *)in_RCX);
  if (pDVar4 != *(Descriptor **)in_RDI) {
    anon_unknown_0::ReportReflectionUsageError
              ((Descriptor *)sub_message_holder,
               (FieldDescriptor *)CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000030,
               in_stack_00000028);
  }
  LVar2 = FieldDescriptor::label((FieldDescriptor *)in_RCX);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              ((Descriptor *)sub_message_holder,
               (FieldDescriptor *)CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000030,
               in_stack_00000028);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x40981f);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              ((Descriptor *)sub_message,field,(char *)sub_message_holder,in_stack_0000003c);
  }
  bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)in_RCX);
  if (bVar1) {
    MutableExtensionSet(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    FieldDescriptor::number((FieldDescriptor *)in_RCX);
    FieldDescriptor::type((FieldDescriptor *)in_stack_ffffffffffffffb0);
    internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
              (in_stack_000000c0,in_stack_000000bc,in_stack_000000bb,in_stack_000000b0,
               in_stack_000000a8);
  }
  else {
    pOVar5 = FieldDescriptor::containing_oneof((FieldDescriptor *)in_RCX);
    if (pOVar5 == (OneofDescriptor *)0x0) {
      if (in_RDX == (Reflection *)0x0) {
        ClearBit(in_stack_00000020,in_stack_00000018,in_stack_00000010);
      }
      else {
        SetBit(in_stack_00000020,in_stack_00000018,in_stack_00000010);
      }
      ppMVar6 = MutableRaw<google::protobuf::Message*>
                          (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                           (FieldDescriptor *)in_stack_ffffffffffffffa0);
      pAVar7 = GetArena(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if ((pAVar7 == (Arena *)0x0) && (*ppMVar6 != (Message *)0x0)) {
        (*((*ppMVar6)->super_MessageLite)._vptr_MessageLite[1])();
      }
      *ppMVar6 = (Message *)in_RDX;
    }
    else if (in_RDX == (Reflection *)0x0) {
      FieldDescriptor::containing_oneof((FieldDescriptor *)in_RCX);
      ClearOneof(in_RCX,in_stack_ffffffffffffffd8,in_RDI);
    }
    else {
      FieldDescriptor::containing_oneof((FieldDescriptor *)in_RCX);
      ClearOneof(in_RCX,in_stack_ffffffffffffffd8,in_RDI);
      ppMVar6 = MutableRaw<google::protobuf::Message*>
                          (in_RDX,in_RSI,(FieldDescriptor *)in_stack_ffffffffffffffa0);
      *ppMVar6 = (Message *)in_RDX;
      SetOneofCase(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(FieldDescriptor *)in_RDX);
    }
  }
  return;
}

Assistant:

void Reflection::UnsafeArenaSetAllocatedMessage(
    Message* message, Message* sub_message,
    const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(SetAllocatedMessage, SINGULAR, MESSAGE);

  if (field->is_extension()) {
    MutableExtensionSet(message)->UnsafeArenaSetAllocatedMessage(
        field->number(), field->type(), field, sub_message);
  } else {
    if (field->containing_oneof()) {
      if (sub_message == nullptr) {
        ClearOneof(message, field->containing_oneof());
        return;
      }
        ClearOneof(message, field->containing_oneof());
        *MutableRaw<Message*>(message, field) = sub_message;
      SetOneofCase(message, field);
      return;
    }

    if (sub_message == nullptr) {
      ClearBit(message, field);
    } else {
      SetBit(message, field);
    }
    Message** sub_message_holder = MutableRaw<Message*>(message, field);
    if (GetArena(message) == nullptr) {
      delete *sub_message_holder;
    }
    *sub_message_holder = sub_message;
  }
}